

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceDescriptor
          (Generator *this,ServiceDescriptor *descriptor)

{
  int iVar1;
  int iVar2;
  ServiceOptions *this_00;
  string *psVar3;
  mapped_type *pmVar4;
  MethodOptions *this_01;
  Descriptor *pDVar5;
  int __c;
  int i_00;
  int __c_00;
  int i_01;
  char *pcVar6;
  allocator<char> local_451;
  key_type local_450;
  allocator<char> local_429;
  string local_428;
  string local_408;
  allocator<char> local_3e1;
  key_type local_3e0;
  string local_3c0;
  allocator<char> local_399;
  key_type local_398;
  string local_378;
  allocator<char> local_351;
  key_type local_350;
  string local_330;
  allocator<char> local_309;
  key_type local_308;
  string local_2e8;
  allocator<char> local_2c1;
  key_type local_2c0;
  allocator<char> local_299;
  key_type local_298;
  MethodDescriptor *local_278;
  MethodDescriptor *method;
  undefined1 local_268 [4];
  int i;
  ServiceDescriptorProto sdp;
  char required_function_arguments [94];
  allocator<char> local_1c1;
  key_type local_1c0;
  allocator<char> local_199;
  string local_198;
  string local_178;
  allocator<char> local_151;
  key_type local_150;
  string local_130;
  allocator<char> local_109;
  key_type local_108;
  allocator<char> local_e1;
  key_type local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  undefined1 local_58 [8];
  string options_string;
  string service_name;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  
  io::Printer::Print(this->printer_,"\n");
  ModuleLevelServiceDescriptorName_abi_cxx11_
            ((string *)((long)&options_string.field_2 + 8),this,descriptor);
  std::__cxx11::string::string((string *)local_58);
  this_00 = ServiceDescriptor::options(descriptor);
  MessageLite::SerializeToString((MessageLite *)this_00,(string *)local_58);
  io::Printer::Print(this->printer_,"$service_name$ = _descriptor.ServiceDescriptor(\n",
                     "service_name",(string *)((long)&options_string.field_2 + 8));
  io::Printer::Indent(this->printer_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_98);
  psVar3 = ServiceDescriptor::name_abi_cxx11_(descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"name",&local_b9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_98,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  psVar3 = ServiceDescriptor::full_name_abi_cxx11_(descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"full_name",&local_e1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_98,&local_e0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"file",&local_109);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_98,&local_108);
  pcVar6 = "DESCRIPTOR";
  std::__cxx11::string::operator=((string *)pmVar4,"DESCRIPTOR");
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pcVar6 = ServiceDescriptor::index(descriptor,pcVar6,__c);
  SimpleItoa_abi_cxx11_(&local_130,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"index",&local_151);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_98,&local_150);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"ServiceOptions",&local_199);
  OptionsValue(&local_178,this,&local_198,(string *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"options_value",&local_1c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_98,&local_1c0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  sdp.options_ = (ServiceOptions *)0x6e24273d656d616e;
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_98,(char *)&sdp.options_);
  ServiceDescriptorProto::ServiceDescriptorProto((ServiceDescriptorProto *)local_268);
  PrintSerializedPbInterval<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
            (this,descriptor,(ServiceDescriptorProto *)local_268);
  io::Printer::Print(this->printer_,"methods=[\n");
  method._4_4_ = 0;
  while( true ) {
    iVar1 = method._4_4_;
    iVar2 = ServiceDescriptor::method_count(descriptor);
    if (iVar2 <= iVar1) break;
    local_278 = ServiceDescriptor::method(descriptor,method._4_4_);
    this_01 = MethodDescriptor::options(local_278);
    MessageLite::SerializeToString((MessageLite *)this_01,(string *)local_58);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_98);
    psVar3 = MethodDescriptor::name_abi_cxx11_(local_278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"name",&local_299);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_298);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    psVar3 = MethodDescriptor::full_name_abi_cxx11_(local_278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"full_name",&local_2c1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_2c0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    pcVar6 = MethodDescriptor::index(local_278,(char *)psVar3,__c_00);
    SimpleItoa_abi_cxx11_(&local_2e8,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"index",&local_309);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_308);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    std::__cxx11::string::~string((string *)&local_2e8);
    CEscape(&local_330,(string *)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"serialized_options",&local_351);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_350);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    std::__cxx11::string::~string((string *)&local_330);
    pDVar5 = MethodDescriptor::input_type(local_278);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_378,this,pDVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"input_type",&local_399)
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_398);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::__cxx11::string::~string((string *)&local_378);
    pDVar5 = MethodDescriptor::output_type(local_278);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_3c0,this,pDVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"output_type",&local_3e1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_3e0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"MethodOptions",&local_429);
    OptionsValue(&local_408,this,&local_428,(string *)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"options_value",&local_451);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,&local_450);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    io::Printer::Print(this->printer_,"_descriptor.MethodDescriptor(\n");
    io::Printer::Indent(this->printer_);
    io::Printer::Print(this->printer_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_98,
                       "name=\'$name$\',\nfull_name=\'$full_name$\',\nindex=$index$,\ncontaining_service=None,\ninput_type=$input_type$,\noutput_type=$output_type$,\noptions=$options_value$,\n"
                      );
    io::Printer::Outdent(this->printer_);
    io::Printer::Print(this->printer_,"),\n");
    method._4_4_ = method._4_4_ + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"])\n\n");
  ServiceDescriptorProto::~ServiceDescriptorProto((ServiceDescriptorProto *)local_268);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_98);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(options_string.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Generator::PrintServiceDescriptor(
    const ServiceDescriptor& descriptor) const {
  printer_->Print("\n");
  string service_name = ModuleLevelServiceDescriptorName(descriptor);
  string options_string;
  descriptor.options().SerializeToString(&options_string);

  printer_->Print(
      "$service_name$ = _descriptor.ServiceDescriptor(\n",
      "service_name", service_name);
  printer_->Indent();
  std::map<string, string> m;
  m["name"] = descriptor.name();
  m["full_name"] = descriptor.full_name();
  m["file"] = kDescriptorKey;
  m["index"] = SimpleItoa(descriptor.index());
  m["options_value"] = OptionsValue("ServiceOptions", options_string);
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "file=$file$,\n"
      "index=$index$,\n"
      "options=$options_value$,\n";
  printer_->Print(m, required_function_arguments);

  ServiceDescriptorProto sdp;
  PrintSerializedPbInterval(descriptor, sdp);

  printer_->Print("methods=[\n");
  for (int i = 0; i < descriptor.method_count(); ++i) {
    const MethodDescriptor* method = descriptor.method(i);
    method->options().SerializeToString(&options_string);

    m.clear();
    m["name"] = method->name();
    m["full_name"] = method->full_name();
    m["index"] = SimpleItoa(method->index());
    m["serialized_options"] = CEscape(options_string);
    m["input_type"] = ModuleLevelDescriptorName(*(method->input_type()));
    m["output_type"] = ModuleLevelDescriptorName(*(method->output_type()));
    m["options_value"] = OptionsValue("MethodOptions", options_string);
    printer_->Print("_descriptor.MethodDescriptor(\n");
    printer_->Indent();
    printer_->Print(
        m,
        "name='$name$',\n"
        "full_name='$full_name$',\n"
        "index=$index$,\n"
        "containing_service=None,\n"
        "input_type=$input_type$,\n"
        "output_type=$output_type$,\n"
        "options=$options_value$,\n");
    printer_->Outdent();
    printer_->Print("),\n");
  }

  printer_->Outdent();
  printer_->Print("])\n\n");
}